

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

token_type __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::scan_number(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              *this)

{
  int iVar1;
  char cVar2;
  int_type iVar3;
  char *pcVar4;
  int *piVar5;
  ulonglong uVar6;
  token_type tVar7;
  double dVar8;
  long lStack_30;
  char *endptr;
  
  reset(this);
  iVar1 = this->current;
  cVar2 = (char)this;
  if (iVar1 - 0x31U < 9) {
    tVar7 = value_unsigned;
LAB_0019d480:
    std::__cxx11::string::push_back(cVar2 + 'H');
    while (iVar3 = get(this), iVar3 - 0x30U < 10) {
      std::__cxx11::string::push_back(cVar2 + 'H');
    }
    if (iVar3 == 0x2e) {
LAB_0019d524:
      std::__cxx11::string::push_back(cVar2 + 'H');
      iVar3 = get(this);
      if (9 < iVar3 - 0x30U) {
        pcVar4 = "invalid number; expected digit after \'.\'";
        goto LAB_0019d6f5;
      }
      do {
        std::__cxx11::string::push_back(cVar2 + 'H');
        iVar3 = get(this);
      } while (iVar3 - 0x30U < 10);
      if ((iVar3 == 0x65) || (iVar3 == 0x45)) goto LAB_0019d4c1;
      tVar7 = value_float;
    }
    else if ((iVar3 == 0x45) || (iVar3 == 0x65)) goto LAB_0019d4c1;
  }
  else {
    if (iVar1 == 0x30) {
      tVar7 = value_unsigned;
    }
    else {
      if (iVar1 != 0x2d) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                      ,0xb7c,
                      "token_type nlohmann::detail::lexer<nlohmann::basic_json<>>::scan_number() [BasicJsonType = nlohmann::basic_json<>]"
                     );
      }
      std::__cxx11::string::push_back(cVar2 + 'H');
      iVar3 = get(this);
      if (iVar3 - 0x31U < 9) {
        tVar7 = value_integer;
        goto LAB_0019d480;
      }
      if (iVar3 != 0x30) {
        pcVar4 = "invalid number; expected digit after \'-\'";
        goto LAB_0019d6f5;
      }
      tVar7 = value_integer;
    }
    std::__cxx11::string::push_back(cVar2 + 'H');
    iVar3 = get(this);
    if ((iVar3 != 0x65) && (iVar3 != 0x45)) {
      if (iVar3 != 0x2e) goto LAB_0019d63e;
      goto LAB_0019d524;
    }
LAB_0019d4c1:
    std::__cxx11::string::push_back(cVar2 + 'H');
    iVar3 = get(this);
    if (9 < iVar3 - 0x30U) {
      if ((iVar3 != 0x2d) && (iVar3 != 0x2b)) {
        pcVar4 = "invalid number; expected \'+\', \'-\', or digit after exponent";
LAB_0019d6f5:
        this->error_message = pcVar4;
        return parse_error;
      }
      std::__cxx11::string::push_back(cVar2 + 'H');
      iVar3 = get(this);
      if (9 < iVar3 - 0x30U) {
        pcVar4 = "invalid number; expected digit after exponent sign";
        goto LAB_0019d6f5;
      }
    }
    std::__cxx11::string::push_back(cVar2 + 'H');
    tVar7 = value_float;
    while (iVar3 = get(this), iVar3 - 0x30U < 10) {
      std::__cxx11::string::push_back(cVar2 + 'H');
    }
  }
LAB_0019d63e:
  unget(this);
  endptr = (char *)0x0;
  piVar5 = __errno_location();
  *piVar5 = 0;
  pcVar4 = (this->token_buffer)._M_dataplus._M_p;
  if (tVar7 == value_integer) {
    uVar6 = strtoll(pcVar4,&endptr,10);
    pcVar4 = (this->token_buffer)._M_dataplus._M_p;
    if (endptr != pcVar4 + (this->token_buffer)._M_string_length) {
      __assert_fail("endptr == token_buffer.data() + token_buffer.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                    ,0xc65,
                    "token_type nlohmann::detail::lexer<nlohmann::basic_json<>>::scan_number() [BasicJsonType = nlohmann::basic_json<>]"
                   );
    }
    if (*piVar5 == 0) {
      lStack_30 = 0x70;
LAB_0019d6de:
      *(ulonglong *)
       ((long)&(this->ia).
               super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr + lStack_30) = uVar6;
      return tVar7;
    }
  }
  else if (tVar7 == value_unsigned) {
    uVar6 = strtoull(pcVar4,&endptr,10);
    pcVar4 = (this->token_buffer)._M_dataplus._M_p;
    if (endptr != pcVar4 + (this->token_buffer)._M_string_length) {
      __assert_fail("endptr == token_buffer.data() + token_buffer.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                    ,0xc59,
                    "token_type nlohmann::detail::lexer<nlohmann::basic_json<>>::scan_number() [BasicJsonType = nlohmann::basic_json<>]"
                   );
    }
    if (*piVar5 == 0) {
      lStack_30 = 0x78;
      goto LAB_0019d6de;
    }
  }
  dVar8 = strtod(pcVar4,&endptr);
  this->value_float = dVar8;
  if (endptr == (this->token_buffer)._M_dataplus._M_p + (this->token_buffer)._M_string_length) {
    return value_float;
  }
  __assert_fail("endptr == token_buffer.data() + token_buffer.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                ,0xc74,
                "token_type nlohmann::detail::lexer<nlohmann::basic_json<>>::scan_number() [BasicJsonType = nlohmann::basic_json<>]"
               );
}

Assistant:

token_type scan_number()  // lgtm [cpp/use-of-goto]
	{
		// reset token_buffer to store the number's bytes
		reset();

		// the type of the parsed number; initially set to unsigned; will be
		// changed if minus sign, decimal point or exponent is read
		token_type number_type = token_type::value_unsigned;

		// state (init): we just found out we need to scan a number
		switch (current) {
			case '-': {
				add(current);
				goto scan_number_minus;
			}

			case '0': {
				add(current);
				goto scan_number_zero;
			}

			case '1':
			case '2':
			case '3':
			case '4':
			case '5':
			case '6':
			case '7':
			case '8':
			case '9': {
				add(current);
				goto scan_number_any1;
			}

			// LCOV_EXCL_START
			default: {
				// all other characters are rejected outside scan_number()
				assert(false);
			}
				// LCOV_EXCL_STOP
		}

	scan_number_minus:
		// state: we just parsed a leading minus sign
		number_type = token_type::value_integer;
		switch (get()) {
			case '0': {
				add(current);
				goto scan_number_zero;
			}

			case '1':
			case '2':
			case '3':
			case '4':
			case '5':
			case '6':
			case '7':
			case '8':
			case '9': {
				add(current);
				goto scan_number_any1;
			}

			default: {
				error_message = "invalid number; expected digit after '-'";
				return token_type::parse_error;
			}
		}

	scan_number_zero:
		// state: we just parse a zero (maybe with a leading minus sign)
		switch (get()) {
			case '.': {
				add(decimal_point_char);
				goto scan_number_decimal1;
			}

			case 'e':
			case 'E': {
				add(current);
				goto scan_number_exponent;
			}

			default:
				goto scan_number_done;
		}

	scan_number_any1:
		// state: we just parsed a number 0-9 (maybe with a leading minus sign)
		switch (get()) {
			case '0':
			case '1':
			case '2':
			case '3':
			case '4':
			case '5':
			case '6':
			case '7':
			case '8':
			case '9': {
				add(current);
				goto scan_number_any1;
			}

			case '.': {
				add(decimal_point_char);
				goto scan_number_decimal1;
			}

			case 'e':
			case 'E': {
				add(current);
				goto scan_number_exponent;
			}

			default:
				goto scan_number_done;
		}

	scan_number_decimal1:
		// state: we just parsed a decimal point
		number_type = token_type::value_float;
		switch (get()) {
			case '0':
			case '1':
			case '2':
			case '3':
			case '4':
			case '5':
			case '6':
			case '7':
			case '8':
			case '9': {
				add(current);
				goto scan_number_decimal2;
			}

			default: {
				error_message = "invalid number; expected digit after '.'";
				return token_type::parse_error;
			}
		}

	scan_number_decimal2:
		// we just parsed at least one number after a decimal point
		switch (get()) {
			case '0':
			case '1':
			case '2':
			case '3':
			case '4':
			case '5':
			case '6':
			case '7':
			case '8':
			case '9': {
				add(current);
				goto scan_number_decimal2;
			}

			case 'e':
			case 'E': {
				add(current);
				goto scan_number_exponent;
			}

			default:
				goto scan_number_done;
		}

	scan_number_exponent:
		// we just parsed an exponent
		number_type = token_type::value_float;
		switch (get()) {
			case '+':
			case '-': {
				add(current);
				goto scan_number_sign;
			}

			case '0':
			case '1':
			case '2':
			case '3':
			case '4':
			case '5':
			case '6':
			case '7':
			case '8':
			case '9': {
				add(current);
				goto scan_number_any2;
			}

			default: {
				error_message = "invalid number; expected '+', '-', or digit after exponent";
				return token_type::parse_error;
			}
		}

	scan_number_sign:
		// we just parsed an exponent sign
		switch (get()) {
			case '0':
			case '1':
			case '2':
			case '3':
			case '4':
			case '5':
			case '6':
			case '7':
			case '8':
			case '9': {
				add(current);
				goto scan_number_any2;
			}

			default: {
				error_message = "invalid number; expected digit after exponent sign";
				return token_type::parse_error;
			}
		}

	scan_number_any2:
		// we just parsed a number after the exponent or exponent sign
		switch (get()) {
			case '0':
			case '1':
			case '2':
			case '3':
			case '4':
			case '5':
			case '6':
			case '7':
			case '8':
			case '9': {
				add(current);
				goto scan_number_any2;
			}

			default:
				goto scan_number_done;
		}

	scan_number_done:
		// unget the character after the number (we only read it to know that
		// we are done scanning a number)
		unget();

		char* endptr = nullptr;
		errno = 0;

		// try to parse integers first and fall back to floats
		if (number_type == token_type::value_unsigned) {
			const auto x = std::strtoull(token_buffer.data(), &endptr, 10);

			// we checked the number format before
			assert(endptr == token_buffer.data() + token_buffer.size());

			if (errno == 0) {
				value_unsigned = static_cast<number_unsigned_t>(x);
				if (value_unsigned == x) {
					return token_type::value_unsigned;
				}
			}
		} else if (number_type == token_type::value_integer) {
			const auto x = std::strtoll(token_buffer.data(), &endptr, 10);

			// we checked the number format before
			assert(endptr == token_buffer.data() + token_buffer.size());

			if (errno == 0) {
				value_integer = static_cast<number_integer_t>(x);
				if (value_integer == x) {
					return token_type::value_integer;
				}
			}
		}

		// this code is reached if we parse a floating-point number or if an
		// integer conversion above failed
		strtof(value_float, token_buffer.data(), &endptr);

		// we checked the number format before
		assert(endptr == token_buffer.data() + token_buffer.size());

		return token_type::value_float;
	}